

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

void __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::splitByGeometry(BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  BBox1f BVar1;
  BBox1f BVar2;
  float fVar3;
  PrimRefMB *pPVar4;
  PrimRefVector pmVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  SetMB *pSVar9;
  SetMB *pSVar10;
  PrimRefMB *prim;
  PrimRefMB *l;
  PrimRefMB *prim_00;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  anon_class_1_0_00000001 local_1e9;
  BBox1f local_1e8;
  undefined8 uStack_1e0;
  BBox1f local_1d8;
  undefined8 uStack_1d0;
  BBox1f local_1c0;
  SetMB *local_1b8;
  unsigned_long local_1b0;
  unsigned_long local_1a8;
  SetMB *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined8 local_d4;
  undefined4 local_cc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  
  local_1b0 = (set->super_PrimInfoMB).object_range._begin;
  local_1a8 = (set->super_PrimInfoMB).object_range._end;
  local_158.m128[2] = INFINITY;
  local_158._0_8_ = 0x7f8000007f800000;
  local_158.m128[3] = INFINITY;
  local_148 = 0xff800000;
  uStack_144 = 0xff800000;
  uStack_140 = 0xff800000;
  uStack_13c = 0xff800000;
  local_128 = 0xff800000;
  uStack_124 = 0xff800000;
  uStack_120 = 0xff800000;
  uStack_11c = 0xff800000;
  local_108 = 0xff800000;
  uStack_104 = 0xff800000;
  uStack_100 = 0xff800000;
  uStack_fc = 0xff800000;
  local_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  auVar14._8_4_ = 0x3f800000;
  auVar14._0_8_ = 0x3f8000003f800000;
  auVar14._12_4_ = 0x3f800000;
  local_d4 = vmovlps_avx(auVar14);
  local_cc = 0;
  local_b8 = 0xff800000;
  uStack_b4 = 0xff800000;
  uStack_b0 = 0xff800000;
  uStack_ac = 0xff800000;
  local_98 = 0xff800000;
  uStack_94 = 0xff800000;
  uStack_90 = 0xff800000;
  uStack_8c = 0xff800000;
  local_78 = 0xff800000;
  uStack_74 = 0xff800000;
  uStack_70 = 0xff800000;
  uStack_6c = 0xff800000;
  local_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_44 = vmovlps_avx(auVar14);
  local_3c = 0;
  pPVar4 = set->prims->items;
  prim_00 = pPVar4 + local_1b0;
  fVar3 = pPVar4[local_1b0].lbounds.bounds0.lower.field_0.m128[3];
  prim = pPVar4 + local_1a8;
  local_1e8 = (BBox1f)-(long)pPVar4;
  local_1d8 = (BBox1f)set;
  local_1b8 = lset;
  local_1a0 = rset;
  local_138 = local_158;
  local_118 = local_158;
  local_c8 = local_158;
  local_a8 = local_158;
  local_88 = local_158;
  do {
    prim = prim + -1;
    lVar11 = (long)&(prim_00->lbounds).bounds0.lower.field_0 + (long)local_1e8;
    while ((prim_00 <= prim && ((prim_00->lbounds).bounds0.lower.field_0.m128[3] == fVar3))) {
      splitByGeometry::anon_class_1_0_00000001::operator()
                (&local_1e9,(PrimInfoMB *)&local_158.field_1,prim_00);
      prim_00 = prim_00 + 1;
      lVar11 = lVar11 + 0x50;
    }
    while( true ) {
      pSVar9 = local_1b8;
      BVar2 = local_1d8;
      if (prim < prim_00) {
        pmVar5 = *(PrimRefVector *)((long)local_1d8 + 0x90);
        local_1e8 = ((PrimInfoMB *)local_1d8)->time_range;
        uStack_1e0 = 0;
        PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                  (&local_1b8->super_PrimInfoMB,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_158.field_1);
        pSVar10 = local_1a0;
        pSVar9->prims = pmVar5;
        (pSVar9->super_PrimInfoMB).object_range._begin = local_1b0;
        (pSVar9->super_PrimInfoMB).object_range._end = lVar11 / 0x50;
        auVar12._8_8_ = 0;
        auVar12._0_4_ = (pSVar9->super_PrimInfoMB).time_range.lower;
        auVar12._4_4_ = (pSVar9->super_PrimInfoMB).time_range.upper;
        auVar7._8_8_ = uStack_1e0;
        auVar7._0_4_ = local_1e8.lower;
        auVar7._4_4_ = local_1e8.upper;
        auVar14 = vcmpps_avx(auVar12,auVar7,1);
        auVar6 = vinsertps_avx(auVar7,auVar12,0x50);
        auVar7 = vinsertps_avx(auVar12,auVar7,0x50);
        auVar14 = vblendvps_avx(auVar7,auVar6,auVar14);
        BVar1 = (BBox1f)vmovlps_avx(auVar14);
        (pSVar9->super_PrimInfoMB).time_range = BVar1;
        pmVar5 = *(PrimRefVector *)((long)BVar2 + 0x90);
        local_1d8 = ((PrimInfoMB *)BVar2)->time_range;
        uStack_1d0 = 0;
        PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                  (&local_1a0->super_PrimInfoMB,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_c8.field_1);
        pSVar10->prims = pmVar5;
        (pSVar10->super_PrimInfoMB).object_range._begin = lVar11 / 0x50;
        (pSVar10->super_PrimInfoMB).object_range._end = local_1a8;
        auVar13._8_8_ = 0;
        auVar13._0_4_ = (pSVar10->super_PrimInfoMB).time_range.lower;
        auVar13._4_4_ = (pSVar10->super_PrimInfoMB).time_range.upper;
        auVar8._8_8_ = uStack_1d0;
        auVar8._0_4_ = local_1d8.lower;
        auVar8._4_4_ = local_1d8.upper;
        auVar14 = vcmpps_avx(auVar13,auVar8,1);
        auVar6 = vinsertps_avx(auVar8,auVar13,0x50);
        auVar7 = vinsertps_avx(auVar13,auVar8,0x50);
        auVar14 = vblendvps_avx(auVar7,auVar6,auVar14);
        BVar2 = (BBox1f)vmovlps_avx(auVar14);
        (pSVar10->super_PrimInfoMB).time_range = BVar2;
        return;
      }
      if ((prim->lbounds).bounds0.lower.field_0.m128[3] == fVar3) break;
      splitByGeometry::anon_class_1_0_00000001::operator()
                (&local_1e9,(PrimInfoMB *)&local_c8.field_1,prim);
      prim = prim + -1;
    }
    splitByGeometry::anon_class_1_0_00000001::operator()
              (&local_1e9,(PrimInfoMB *)&local_158.field_1,prim);
    splitByGeometry::anon_class_1_0_00000001::operator()
              (&local_1e9,(PrimInfoMB *)&local_c8.field_1,prim_00);
    local_178 = *(undefined8 *)&(prim_00->lbounds).bounds0.lower.field_0;
    uStack_170 = *(undefined8 *)((long)&(prim_00->lbounds).bounds0.lower.field_0 + 8);
    uStack_168 = *(undefined8 *)&(prim_00->lbounds).bounds0.upper.field_0;
    uStack_160 = *(undefined8 *)((long)&(prim_00->lbounds).bounds0.upper.field_0 + 8);
    local_198 = *(undefined8 *)&(prim_00->lbounds).bounds1.lower.field_0;
    uStack_190 = *(undefined8 *)((long)&(prim_00->lbounds).bounds1.lower.field_0 + 8);
    uStack_188 = *(undefined8 *)&(prim_00->lbounds).bounds1.upper.field_0;
    uStack_180 = *(undefined8 *)((long)&(prim_00->lbounds).bounds1.upper.field_0 + 8);
    local_1c0 = prim_00->time_range;
    PrimRefMB::operator=(prim_00,prim);
    *(undefined8 *)&(prim->lbounds).bounds0.lower.field_0 = local_178;
    *(undefined8 *)((long)&(prim->lbounds).bounds0.lower.field_0 + 8) = uStack_170;
    *(undefined8 *)&(prim->lbounds).bounds0.upper.field_0 = uStack_168;
    *(undefined8 *)((long)&(prim->lbounds).bounds0.upper.field_0 + 8) = uStack_160;
    *(undefined8 *)&(prim->lbounds).bounds1.lower.field_0 = local_198;
    *(undefined8 *)((long)&(prim->lbounds).bounds1.lower.field_0 + 8) = uStack_190;
    *(undefined8 *)&(prim->lbounds).bounds1.upper.field_0 = uStack_188;
    *(undefined8 *)((long)&(prim->lbounds).bounds1.upper.field_0 + 8) = uStack_180;
    prim->time_range = local_1c0;
    prim_00 = prim_00 + 1;
  } while( true );
}

Assistant:

void splitByGeometry(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            assert(set.size() > 1);

            mvector<PrimRefMB>& prims = *set.prims;
            const size_t begin = set.begin();
            const size_t end   = set.end();
            
            PrimInfoMB left(empty);
            PrimInfoMB right(empty);
            unsigned int geomID = prims[begin].geomID();
            size_t center = serial_partitioning(prims.data(),begin,end,left,right,
                                                [&] ( const PrimRefMB& prim ) { return prim.geomID() == geomID; },
                                                [ ] ( PrimInfoMB& dst, const PrimRefMB& prim ) { dst.add_primref(prim); });
            
            new (&lset) SetMB(left, set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(right,set.prims,range<size_t>(center,end  ),set.time_range);
          }